

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O0

int __thiscall gl4cts::GL44TestPackage::init(GL44TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  Context *pCVar2;
  LayoutBindingTests *this_00;
  SeparateShaderObjsTests *this_01;
  SampleShadingTests *this_02;
  SampleVariablesTests *this_03;
  ShaderMultisampleInterpolationTests *this_04;
  GPUShader5Tests *this_05;
  ExtParameters local_24;
  ExtParameters extParams;
  GL44TestPackage *this_local;
  
  GL43TestPackage::init(&this->super_GL43TestPackage,ctx);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  GL44ShaderTests::GL44ShaderTests((GL44ShaderTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  BufferStorageTests::BufferStorageTests((BufferStorageTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  EnhancedLayoutsTests::EnhancedLayoutsTests((EnhancedLayoutsTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (LayoutBindingTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::LayoutBindingTests::LayoutBindingTests(this_00,pCVar2,GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  MultiBindTests::MultiBindTests((MultiBindTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (SeparateShaderObjsTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::SeparateShaderObjsTests::SeparateShaderObjsTests(this_01,pCVar2,GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (SampleShadingTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::SampleShadingTests::SampleShadingTests(this_02,pCVar2,GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (SampleVariablesTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  deqp::SampleVariablesTests::SampleVariablesTests(this_03,pCVar2,GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (ShaderMultisampleInterpolationTests *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  deqp::ShaderMultisampleInterpolationTests::ShaderMultisampleInterpolationTests
            (this_04,pCVar2,GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0x78);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::ShaderTextureImageSamplesTests::ShaderTextureImageSamplesTests
            ((ShaderTextureImageSamplesTests *)pTVar1,pCVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  glcts::ExtParameters::ExtParameters(&local_24,GLSL_VERSION_440,EXTENSIONTYPE_NONE);
  pTVar1 = (TestNode *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::GeometryShaderTests::GeometryShaderTests((GeometryShaderTests *)pTVar1,pCVar2,&local_24);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_05 = (GPUShader5Tests *)operator_new(0x88);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::GPUShader5Tests::GPUShader5Tests(this_05,pCVar2,&local_24);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  pTVar1 = (TestNode *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::TessellationShaderTests::TessellationShaderTests
            ((TessellationShaderTests *)pTVar1,pCVar2,&local_24);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::TextureCubeMapArrayTests::TextureCubeMapArrayTests
            ((TextureCubeMapArrayTests *)pTVar1,pCVar2,&local_24);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::TextureBorderClampTests::TextureBorderClampTests
            ((TextureBorderClampTests *)pTVar1,pCVar2,&local_24);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  pCVar2 = deqp::TestPackage::getContext((TestPackage *)this);
  glcts::TextureBufferTests::TextureBufferTests((TextureBufferTests *)pTVar1,pCVar2,&local_24);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GL44TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL43TestPackage::init();

	try
	{
		addChild(new GL44ShaderTests(getContext()));
		addChild(new gl4cts::BufferStorageTests(getContext()));
		addChild(new gl4cts::EnhancedLayoutsTests(getContext()));
		addChild(new glcts::LayoutBindingTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new gl4cts::MultiBindTests(getContext()));
		addChild(new glcts::SeparateShaderObjsTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new glcts::SampleShadingTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new deqp::SampleVariablesTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new deqp::ShaderMultisampleInterpolationTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new glcts::ShaderTextureImageSamplesTests(getContext()));

		glcts::ExtParameters extParams(glu::GLSL_VERSION_440, glcts::EXTENSIONTYPE_NONE);
		addChild(new glcts::GeometryShaderTests(getContext(), extParams));
		addChild(new glcts::GPUShader5Tests(getContext(), extParams));
		addChild(new glcts::TessellationShaderTests(getContext(), extParams));
		addChild(new glcts::TextureCubeMapArrayTests(getContext(), extParams));
		addChild(new glcts::TextureBorderClampTests(getContext(), extParams));
		addChild(new glcts::TextureBufferTests(getContext(), extParams));

		//addChild(new gl4cts::ContextFlushControl::Tests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}